

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall ncnn::Extractor::~Extractor(Extractor *this)

{
  Extractor *in_RDI;
  
  ~Extractor(in_RDI);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

Extractor::~Extractor()
{
    clear();

    delete d;
}